

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O1

uchar * SnapshotDicoInsert(char *symbol_name,int ptr,int *retidx)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  uchar *puVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = SnapshotDicoInsert::idx;
  if (retidx == (int *)0x0) {
    lVar7 = (long)SnapshotDicoInsert::idx;
    lVar6 = (long)SnapshotDicoInsert::subchunksize;
    if (SnapshotDicoInsert::subchunksize < SnapshotDicoInsert::idx + 0x10000) {
      SnapshotDicoInsert::subchunksize = (int)(lVar6 + 0x10000U);
      SnapshotDicoInsert::subchunk = (uchar *)realloc(SnapshotDicoInsert::subchunk,lVar6 + 0x10000U)
      ;
    }
    sVar3 = strlen(symbol_name);
    puVar4 = SnapshotDicoInsert::subchunk;
    iVar5 = 0xff;
    if ((int)sVar3 < 0xff) {
      iVar5 = (int)sVar3;
    }
    SnapshotDicoInsert::idx = iVar2 + 1;
    puVar1 = SnapshotDicoInsert::subchunk + lVar7;
    *puVar1 = (uchar)iVar5;
    memcpy(puVar1 + 1,symbol_name,(long)iVar5);
    lVar6 = (long)(iVar5 + iVar2 + 1);
    puVar1 = puVar4 + lVar6;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    (puVar4 + lVar6 + 4)[0] = '\0';
    (puVar4 + lVar6 + 4)[1] = '\0';
    puVar4[lVar6 + 6] = (uchar)((uint)ptr >> 8);
    SnapshotDicoInsert::idx = iVar5 + iVar2 + 9;
    puVar4[lVar6 + 7] = (uchar)ptr;
    puVar4 = (uchar *)0x0;
  }
  else {
    if (symbol_name != (char *)0x0) {
      iVar2 = strcmp(symbol_name,"FREE");
      if (iVar2 == 0) {
        SnapshotDicoInsert::subchunksize = 0;
        SnapshotDicoInsert::idx = 0;
        free(SnapshotDicoInsert::subchunk);
        SnapshotDicoInsert::subchunk = (uchar *)0x0;
      }
    }
    *retidx = SnapshotDicoInsert::idx;
    puVar4 = SnapshotDicoInsert::subchunk;
  }
  return puVar4;
}

Assistant:

unsigned char *SnapshotDicoInsert(char *symbol_name, int ptr, int *retidx)
{
	static unsigned char *subchunk=NULL;
	static int subchunksize=0;
	static int idx=0;
	int symbol_len;
	
	if (retidx) {
		if (symbol_name && strcmp(symbol_name,"FREE")==0) {
			subchunksize=0;
			idx=0;
			MemFree(subchunk);
			subchunk=NULL;
		}
		*retidx=idx;
		return subchunk;
	}
	
	if (idx+65536>subchunksize) {
		subchunksize=subchunksize+65536;
		subchunk=MemRealloc(subchunk,subchunksize);
	}
	
	symbol_len=strlen(symbol_name);
	if (symbol_len>255) symbol_len=255;
	subchunk[idx++]=symbol_len;
	memcpy(subchunk+idx,symbol_name,symbol_len);
	idx+=symbol_len;
	memset(subchunk+idx,0,6);
	idx+=6;
	subchunk[idx++]=(ptr&0xFF00)/256;
	subchunk[idx++]=ptr&0xFF;
	return NULL;
}